

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_split_128(secp256k1_scalar *r1,secp256k1_scalar *r2,secp256k1_scalar *k)

{
  secp256k1_scalar_verify(k);
  r1->d[0] = k->d[0];
  r1->d[1] = k->d[1];
  r1->d[2] = 0;
  r1->d[3] = 0;
  r2->d[0] = k->d[2];
  r2->d[1] = k->d[3];
  r2->d[2] = 0;
  r2->d[3] = 0;
  secp256k1_scalar_verify(r1);
  secp256k1_scalar_verify(r2);
  return;
}

Assistant:

static void secp256k1_scalar_split_128(secp256k1_scalar *r1, secp256k1_scalar *r2, const secp256k1_scalar *k) {
    SECP256K1_SCALAR_VERIFY(k);

    r1->d[0] = k->d[0];
    r1->d[1] = k->d[1];
    r1->d[2] = 0;
    r1->d[3] = 0;
    r2->d[0] = k->d[2];
    r2->d[1] = k->d[3];
    r2->d[2] = 0;
    r2->d[3] = 0;

    SECP256K1_SCALAR_VERIFY(r1);
    SECP256K1_SCALAR_VERIFY(r2);
}